

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::absolute(path *__return_storage_ptr__,path *p)

{
  bool bVar1;
  int code;
  filesystem_error *this;
  error_code ec_00;
  string local_50;
  undefined1 local_29;
  undefined1 auStack_28 [8];
  error_code ec;
  path *p_local;
  path *result;
  
  ec._M_cat = (error_category *)p;
  std::error_code::error_code((error_code *)auStack_28);
  local_29 = 0;
  absolute(__return_storage_ptr__,(path *)ec._M_cat,(error_code *)auStack_28);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_28);
  if (bVar1) {
    this = (filesystem_error *)__cxa_allocate_exception(0x90);
    code = std::error_code::value((error_code *)auStack_28);
    detail::systemErrorText<int>(&local_50,code);
    ec_00._0_8_ = (ulong)auStack_28 & 0xffffffff;
    ec_00._M_cat = (error_category *)ec._0_8_;
    filesystem_error::filesystem_error(this,&local_50,(path *)ec._M_cat,ec_00);
    __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path absolute(const path& p)
{
    std::error_code ec;
    path result = absolute(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}